

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimitingSampler.h
# Opt level: O0

void __thiscall
jaegertracing::samplers::RateLimitingSampler::RateLimitingSampler
          (RateLimitingSampler *this,double maxTracesPerSecond)

{
  double creditsPerSecond;
  initializer_list<jaegertracing::Tag> __l;
  double *pdVar1;
  Tag *local_170;
  allocator<jaegertracing::Tag> local_123;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  Tag *local_d8;
  Tag local_d0;
  Tag local_88;
  iterator local_40;
  size_type local_38;
  double local_20;
  undefined1 local_18 [8];
  double maxTracesPerSecond_local;
  RateLimitingSampler *this_local;
  
  local_18 = (undefined1  [8])maxTracesPerSecond;
  maxTracesPerSecond_local = (double)this;
  Sampler::Sampler(&this->super_Sampler);
  (this->super_Sampler)._vptr_Sampler = (_func_int **)&PTR__RateLimitingSampler_004f9760;
  this->_maxTracesPerSecond = (double)local_18;
  creditsPerSecond = this->_maxTracesPerSecond;
  local_20 = 1.0;
  pdVar1 = std::max<double>(&this->_maxTracesPerSecond,&local_20);
  utils::RateLimiter<std::chrono::_V2::steady_clock>::RateLimiter
            (&this->_rateLimiter,creditsPerSecond,*pdVar1);
  local_122 = 1;
  local_d8 = &local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"sampler.type",&local_f9);
  Tag::Tag<char_const*const&>(&local_d0,&local_f8,&kSamplerTypeRateLimiting);
  local_d8 = &local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"sampler.param",&local_121);
  Tag::Tag<double&>(&local_88,&local_120,(double *)local_18);
  local_122 = 0;
  local_40 = &local_d0;
  local_38 = 2;
  std::allocator<jaegertracing::Tag>::allocator(&local_123);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
            (&this->_tags,__l,&local_123);
  std::allocator<jaegertracing::Tag>::~allocator(&local_123);
  local_170 = (Tag *)&local_40;
  do {
    local_170 = local_170 + -1;
    Tag::~Tag(local_170);
  } while (local_170 != &local_d0);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  return;
}

Assistant:

explicit RateLimitingSampler(double maxTracesPerSecond)
        : _maxTracesPerSecond(maxTracesPerSecond)
        , _rateLimiter(_maxTracesPerSecond, std::max(_maxTracesPerSecond, 1.0))
        , _tags({ { kSamplerTypeTagKey, kSamplerTypeRateLimiting },
                  { kSamplerParamTagKey, maxTracesPerSecond } })
    {
    }